

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSort.cpp
# Opt level: O0

void sortSetData(HighsInt num_entries,vector<int,_std::allocator<int>_> *set,double *data0,
                double *data1,double *data2,double *sorted_data0,double *sorted_data1,
                double *sorted_data2)

{
  size_type __n;
  int *piVar1;
  int *piVar2;
  reference pvVar3;
  long in_RCX;
  long in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  int in_EDI;
  long in_R8;
  long in_R9;
  long in_stack_00000008;
  long in_stack_00000010;
  HighsInt ix_1;
  HighsInt ix;
  HighsInt *perm;
  HighsInt *sort_set;
  vector<int,_std::allocator<int>_> perm_vec;
  vector<int,_std::allocator<int>_> sort_set_vec;
  HighsInt *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  int iVar4;
  allocator_type *in_stack_ffffffffffffff50;
  allocator_type *__a;
  vector<int,_std::allocator<int>_> *this;
  int local_98;
  int local_94;
  allocator_type local_79 [48];
  vector<int,_std::allocator<int>_> local_49;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  vector<int,_std::allocator<int>_> *local_10;
  int local_4;
  
  if (0 < in_EDI) {
    __n = (size_type)(in_EDI + 1);
    this = &local_49;
    local_30 = in_R9;
    local_28 = in_R8;
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    local_4 = in_EDI;
    std::allocator<int>::allocator((allocator<int> *)0x7e5644);
    std::vector<int,_std::allocator<int>_>::vector(this,__n,in_stack_ffffffffffffff50);
    std::allocator<int>::~allocator((allocator<int> *)0x7e5667);
    __a = local_79;
    std::allocator<int>::allocator((allocator<int> *)0x7e5686);
    std::vector<int,_std::allocator<int>_>::vector(this,__n,__a);
    std::allocator<int>::~allocator((allocator<int> *)0x7e56a6);
    piVar1 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x7e56b3);
    piVar2 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x7e56c2);
    for (local_94 = 0; local_94 < local_4; local_94 = local_94 + 1) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_10,(long)local_94);
      piVar1[local_94 + 1] = *pvVar3;
      piVar2[local_94 + 1] = local_94;
    }
    maxheapsort((HighsInt *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                in_stack_ffffffffffffff38,0);
    for (local_98 = 0; local_98 < local_4; local_98 = local_98 + 1) {
      iVar4 = piVar1[local_98 + 1];
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_10,(long)local_98);
      *pvVar3 = iVar4;
      if (local_18 != 0) {
        *(undefined8 *)(local_30 + (long)local_98 * 8) =
             *(undefined8 *)(local_18 + (long)piVar2[local_98 + 1] * 8);
      }
      if (local_20 != 0) {
        *(undefined8 *)(in_stack_00000008 + (long)local_98 * 8) =
             *(undefined8 *)(local_20 + (long)piVar2[local_98 + 1] * 8);
      }
      if (local_28 != 0) {
        *(undefined8 *)(in_stack_00000010 + (long)local_98 * 8) =
             *(undefined8 *)(local_28 + (long)piVar2[local_98 + 1] * 8);
      }
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)__a);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)__a);
  }
  return;
}

Assistant:

void sortSetData(const HighsInt num_entries, vector<HighsInt>& set,
                 const double* data0, const double* data1, const double* data2,
                 double* sorted_data0, double* sorted_data1,
                 double* sorted_data2) {
  if (num_entries <= 0) return;
  vector<HighsInt> sort_set_vec(1 + num_entries);
  vector<HighsInt> perm_vec(1 + num_entries);

  HighsInt* sort_set = sort_set_vec.data();
  HighsInt* perm = perm_vec.data();

  for (HighsInt ix = 0; ix < num_entries; ix++) {
    sort_set[1 + ix] = set[ix];
    perm[1 + ix] = ix;
  }
  maxheapsort(sort_set, perm, num_entries);
  for (HighsInt ix = 0; ix < num_entries; ix++) {
    set[ix] = sort_set[1 + ix];
    if (data0 != NULL) sorted_data0[ix] = data0[perm[1 + ix]];
    if (data1 != NULL) sorted_data1[ix] = data1[perm[1 + ix]];
    if (data2 != NULL) sorted_data2[ix] = data2[perm[1 + ix]];
  }
}